

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O3

int WebPWriteBMP(FILE *fout,WebPDecBuffer *buffer)

{
  int iVar1;
  WEBP_CSP_MODE WVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint8_t zeroes [3];
  undefined2 local_9c;
  undefined1 local_9a;
  undefined2 local_98;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined4 local_92;
  char local_8e;
  undefined2 local_8d;
  undefined1 local_8b;
  char local_8a;
  undefined2 local_89;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined2 local_7e;
  char local_7c;
  undefined1 local_7b;
  char local_7a;
  undefined2 local_79;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined4 local_72;
  undefined2 local_6e;
  undefined4 local_6c;
  undefined4 uStack_68;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined6 uStack_60;
  undefined1 uStack_5a;
  undefined4 uStack_59;
  undefined2 uStack_55;
  undefined1 uStack_53;
  ulong local_48;
  long local_40;
  uint8_t *local_38;
  
  uStack_60 = 0;
  uStack_5a = 0;
  uStack_53 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    WVar2 = buffer->colorspace;
    iVar10 = 4;
    uVar9 = 0x46;
    if (((WVar2 < MODE_LAST) && ((0x103aU >> (WVar2 & 0x1f) & 1) != 0)) ||
       (0xfffffffb < WVar2 - MODE_YUV)) {
      bVar5 = false;
    }
    else {
      iVar10 = 3;
      bVar5 = true;
      uVar9 = 0x36;
    }
    local_38 = (buffer->u).RGBA.rgba;
    if (local_38 != (uint8_t *)0x0) {
      iVar3 = buffer->width;
      uVar4 = buffer->height;
      uVar8 = (ulong)uVar4;
      local_40 = (long)(buffer->u).RGBA.stride;
      uVar11 = iVar10 * iVar3;
      uVar12 = uVar11 + 3 & 0xfffffffc;
      iVar7 = uVar12 * uVar4;
      local_98 = 0x4d42;
      iVar1 = iVar7 + uVar9;
      local_96 = (undefined1)iVar1;
      local_95 = (undefined1)((uint)iVar1 >> 8);
      local_94 = (undefined1)((uint)iVar1 >> 0x10);
      local_93 = (undefined1)((uint)iVar1 >> 0x18);
      local_92 = 0;
      local_8e = (char)uVar9;
      local_8d = 0;
      local_8b = 0;
      local_8a = local_8e + -0xe;
      local_89 = 0;
      local_87 = 0;
      local_86 = (undefined1)iVar3;
      local_85 = (undefined1)((uint)iVar3 >> 8);
      local_84 = (undefined1)((uint)iVar3 >> 0x10);
      local_83 = (undefined1)((uint)iVar3 >> 0x18);
      local_82 = (undefined1)uVar4;
      local_81 = (undefined1)(uVar4 >> 8);
      local_80 = (undefined1)(uVar4 >> 0x10);
      local_7f = (undefined1)(uVar4 >> 0x18);
      local_7e = 1;
      local_7c = (char)iVar10 << 3;
      local_7b = 0;
      local_7a = !bVar5 * '\x03';
      local_79 = 0;
      local_77 = 0;
      local_76 = (undefined1)iVar7;
      local_75 = (undefined1)((uint)iVar7 >> 8);
      local_74 = (undefined1)((uint)iVar7 >> 0x10);
      local_73 = (undefined1)((uint)iVar7 >> 0x18);
      local_72 = 0x960;
      local_6e = 0x960;
      uStack_64 = 0;
      local_6c = 0;
      uStack_68 = 0;
      if (!bVar5) {
        uStack_60 = 0xff0000ff;
        uStack_5a = 0xff;
        uStack_53 = 0xff;
      }
      uStack_55 = 0;
      uStack_59 = 0;
      uStack_62 = 0;
      sVar6 = fwrite(&local_98,(ulong)uVar9,1,(FILE *)fout);
      if (sVar6 != 1) {
        return 0;
      }
      if (uVar8 != 0) {
        local_48 = (ulong)(uVar12 - uVar11);
        do {
          sVar6 = fwrite(local_38 + (ulong)((int)uVar8 - 1) * local_40,(ulong)uVar11,1,(FILE *)fout)
          ;
          if (sVar6 != 1) {
            return 0;
          }
          if (uVar12 != uVar11) {
            local_9a = 0;
            local_9c = 0;
            sVar6 = fwrite(&local_9c,local_48,1,(FILE *)fout);
            if (sVar6 != 1) {
              return 0;
            }
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int WebPWriteBMP(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha, header_size;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint32_t y;
  uint32_t bytes_per_px, line_size, image_size, bmp_stride, total_size;
  uint8_t bmp_header[BMP_HEADER_SIZE + BMP_HEADER_ALPHA_EXTRA_SIZE] = { 0 };

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  header_size = BMP_HEADER_SIZE + (has_alpha ? BMP_HEADER_ALPHA_EXTRA_SIZE : 0);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;
  bytes_per_px = has_alpha ? 4 : 3;
  line_size = bytes_per_px * width;
  bmp_stride = (line_size + 3) & ~3;  // pad to 4
  image_size = bmp_stride * height;
  total_size = image_size + header_size;

  if (rgba == NULL) return 0;

  // bitmap file header
  PutLE16(bmp_header + 0, 0x4d42);                // signature 'BM'
  PutLE32(bmp_header + 2, total_size);            // size including header
  PutLE32(bmp_header + 6, 0);                     // reserved
  PutLE32(bmp_header + 10, header_size);          // offset to pixel array
  // bitmap info header
  PutLE32(bmp_header + 14, header_size - 14);     // DIB header size
  PutLE32(bmp_header + 18, width);                // dimensions
  PutLE32(bmp_header + 22, height);               // no vertical flip
  PutLE16(bmp_header + 26, 1);                    // number of planes
  PutLE16(bmp_header + 28, bytes_per_px * 8);     // bits per pixel
  PutLE32(bmp_header + 30, has_alpha ? 3 : 0);    // BI_BITFIELDS or BI_RGB
  PutLE32(bmp_header + 34, image_size);
  PutLE32(bmp_header + 38, 2400);                 // x pixels/meter
  PutLE32(bmp_header + 42, 2400);                 // y pixels/meter
  PutLE32(bmp_header + 46, 0);                    // number of palette colors
  PutLE32(bmp_header + 50, 0);                    // important color count
  if (has_alpha) {  // BITMAPV3INFOHEADER complement
    PutLE32(bmp_header + 54, 0x00ff0000);         // red mask
    PutLE32(bmp_header + 58, 0x0000ff00);         // green mask
    PutLE32(bmp_header + 62, 0x000000ff);         // blue mask
    PutLE32(bmp_header + 66, 0xff000000);         // alpha mask
  }

  // TODO(skal): color profile

  // write header
  if (fwrite(bmp_header, header_size, 1, fout) != 1) {
    return 0;
  }

  // write pixel array, bottom to top
  for (y = 0; y < height; ++y) {
    const uint8_t* const src = &rgba[(uint64_t)(height - 1 - y) * stride];
    if (fwrite(src, line_size, 1, fout) != 1) {
      return 0;
    }
    // write padding zeroes
    if (bmp_stride != line_size) {
      const uint8_t zeroes[3] = { 0 };
      if (fwrite(zeroes, bmp_stride - line_size, 1, fout) != 1) {
        return 0;
      }
    }
  }
  return 1;
}